

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassembly.c
# Opt level: O0

la_reasm_table * la_reasm_table_lookup(la_reasm_ctx *rctx,void *table_id)

{
  void *in_RSI;
  undefined8 *in_RDI;
  la_reasm_table *rt;
  la_list *l;
  la_list *local_20;
  
  local_20 = (la_list *)*in_RDI;
  while( true ) {
    if (local_20 == (la_list *)0x0) {
      return (la_reasm_table *)0x0;
    }
    if (((la_reasm_table *)local_20->data)->key == in_RSI) break;
    local_20 = la_list_next(local_20);
  }
  return (la_reasm_table *)local_20->data;
}

Assistant:

la_reasm_table *la_reasm_table_lookup(la_reasm_ctx *rctx, void const *table_id) {
	la_assert(rctx != NULL);
	la_assert(table_id != NULL);

	for(la_list *l = rctx->rtables; l != NULL; l = la_list_next(l)) {
		la_reasm_table *rt = l->data;
		if(rt->key == table_id) {
			return rt;
		}
	}
	return NULL;
}